

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileWatcherGeneric.cpp
# Opt level: O2

WatchID __thiscall
efsw::FileWatcherGeneric::addWatch
          (FileWatcherGeneric *this,string *directory,FileWatchListener *watcher,bool recursive)

{
  bool bVar1;
  int iVar2;
  Error EVar3;
  WatcherGeneric *this_00;
  WatchID WVar4;
  string *psVar5;
  long id;
  string dir;
  WatcherGeneric *pWatch;
  string link;
  string curPath;
  string local_130;
  string local_110;
  string local_f0;
  string local_d0;
  string local_b0;
  string local_90;
  FileInfo fi;
  
  std::__cxx11::string::string((string *)&dir,(string *)directory);
  FileSystem::dirAddSlashAtEnd(&dir);
  FileInfo::FileInfo(&fi,&dir);
  bVar1 = FileInfo::isDirectory(&fi);
  if (!bVar1) {
    std::__cxx11::string::string((string *)&local_90,(string *)&dir);
    EVar3 = Errors::Log::createLastError(FileNotFound,&local_90);
    WVar4 = (WatchID)EVar3;
    psVar5 = &local_90;
    goto LAB_0011dadd;
  }
  bVar1 = FileInfo::isReadable(&fi);
  if (!bVar1) {
    std::__cxx11::string::string((string *)&local_b0,(string *)&dir);
    EVar3 = Errors::Log::createLastError(FileNotReadable,&local_b0);
    WVar4 = (WatchID)EVar3;
    psVar5 = &local_b0;
    goto LAB_0011dadd;
  }
  iVar2 = (*(this->super_FileWatcherImpl)._vptr_FileWatcherImpl[10])(this,&dir);
  if ((char)iVar2 != '\0') {
    std::__cxx11::string::string((string *)&local_d0,(string *)&dir);
    EVar3 = Errors::Log::createLastError(FileRepeated,&local_d0);
    WVar4 = (WatchID)EVar3;
    psVar5 = &local_d0;
    goto LAB_0011dadd;
  }
  curPath._M_dataplus._M_p = (pointer)&curPath.field_2;
  curPath._M_string_length = 0;
  curPath.field_2._M_local_buf[0] = '\0';
  std::__cxx11::string::string((string *)&local_f0,(string *)&dir);
  FileSystem::getLinkRealPath(&link,&local_f0,&curPath);
  std::__cxx11::string::~string((string *)&local_f0);
  bVar1 = std::operator!=("",&link);
  if (bVar1) {
    iVar2 = (*(this->super_FileWatcherImpl)._vptr_FileWatcherImpl[10])(this,&link);
    if ((char)iVar2 == '\0') {
      iVar2 = (*(this->super_FileWatcherImpl)._vptr_FileWatcherImpl[9])(this,&curPath,&link);
      if ((char)iVar2 != '\0') {
        std::__cxx11::string::_M_assign((string *)&dir);
        goto LAB_0011da44;
      }
      std::__cxx11::string::string((string *)&local_130,(string *)&dir);
      EVar3 = Errors::Log::createLastError(FileOutOfScope,&local_130);
      psVar5 = &local_130;
    }
    else {
      std::__cxx11::string::string((string *)&local_110,(string *)&dir);
      EVar3 = Errors::Log::createLastError(FileRepeated,&local_110);
      psVar5 = &local_110;
    }
    WVar4 = (WatchID)EVar3;
    std::__cxx11::string::~string((string *)psVar5);
  }
  else {
LAB_0011da44:
    id = this->mLastWatchID + 1;
    this->mLastWatchID = id;
    this_00 = (WatcherGeneric *)operator_new(0x70);
    WatcherGeneric::WatcherGeneric(this_00,id,&dir,watcher,&this->super_FileWatcherImpl,recursive);
    pWatch = this_00;
    Mutex::lock(&this->mWatchesLock);
    std::__cxx11::list<efsw::WatcherGeneric_*,_std::allocator<efsw::WatcherGeneric_*>_>::push_back
              (&this->mWatches,&pWatch);
    Mutex::unlock(&this->mWatchesLock);
    WVar4 = (pWatch->super_Watcher).ID;
  }
  std::__cxx11::string::~string((string *)&link);
  psVar5 = &curPath;
LAB_0011dadd:
  std::__cxx11::string::~string((string *)psVar5);
  std::__cxx11::string::~string((string *)&fi);
  std::__cxx11::string::~string((string *)&dir);
  return WVar4;
}

Assistant:

WatchID FileWatcherGeneric::addWatch(const std::string& directory, FileWatchListener* watcher, bool recursive)
{
	std::string dir( directory );

	FileSystem::dirAddSlashAtEnd( dir );

	FileInfo fi( dir );

	if ( !fi.isDirectory() )
	{
		return Errors::Log::createLastError( Errors::FileNotFound, dir );
	}
	else if ( !fi.isReadable() )
	{
		return Errors::Log::createLastError( Errors::FileNotReadable, dir );
	}
	else if ( pathInWatches( dir ) )
	{
		return Errors::Log::createLastError( Errors::FileRepeated, dir );
	}

	std::string curPath;
	std::string link( FileSystem::getLinkRealPath( dir, curPath ) );

	if ( "" != link )
	{
		if ( pathInWatches( link ) )
		{
			return Errors::Log::createLastError( Errors::FileRepeated, dir );
		}
		else if ( !linkAllowed( curPath, link ) )
		{
			return Errors::Log::createLastError( Errors::FileOutOfScope, dir );
		}
		else
		{
			dir = link;
		}
	}

	mLastWatchID++;

	WatcherGeneric * pWatch		= new WatcherGeneric( mLastWatchID, dir, watcher, this, recursive );

	mWatchesLock.lock();
	mWatches.push_back(pWatch);
	mWatchesLock.unlock();

	return pWatch->ID;
}